

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O2

void __thiscall DataBuffer::DataBuffer(DataBuffer *this,int size)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = -1;
  if (-1 < size) {
    iVar1 = size;
  }
  pcVar2 = (char *)operator_new__((long)iVar1);
  this->m_buffer = pcVar2;
  this->m_allocatedSize = size;
  this->m_position = pcVar2;
  std::_Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>::_Deque_base
            ((_Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_> *)&this->m_marks);
  std::_Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>::_Deque_base
            ((_Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_> *)&this->m_references);
  return;
}

Assistant:

DataBuffer::DataBuffer (int size) :
	m_buffer (new char[size]),
	m_allocatedSize (size),
	m_position (&buffer()[0]) {}